

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

unsigned_short ** Extra_TruthPerm43(void)

{
  unsigned_short uVar1;
  unsigned_short **ppuVar2;
  long lVar3;
  long lVar4;
  
  ppuVar2 = (unsigned_short **)Extra_ArrayAlloc(0x100,0x10,2);
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      uVar1 = Extra_TruthPerm4One((int)lVar4 * 0x101,(int)lVar3);
      ppuVar2[lVar4][lVar3] = uVar1;
    }
  }
  return ppuVar2;
}

Assistant:

unsigned short ** Extra_TruthPerm43()
{
    unsigned short ** pTable;
    unsigned uTruth;
    int i, k;
    pTable = (unsigned short **)Extra_ArrayAlloc( 256, 16, 2 );
    for ( i = 0; i < 256; i++ )
    {
        uTruth = (i << 8) | i;
        for ( k = 0; k < 16; k++ )
            pTable[i][k] = Extra_TruthPerm4One( uTruth, k );
    }
    return pTable;
}